

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

char * describeLookahead(char *formatstring,char *s)

{
  uint uVar1;
  char *pcVar2;
  
  switch(lookahead) {
  case 400:
    pcVar2 = "%sNOT";
    break;
  case 0x191:
    pcVar2 = "%s%d";
    uVar1 = tokenval;
    goto LAB_001242f1;
  case 0x192:
    sprintf(formatstring,"%s%g",(double)realtokval,s);
    return formatstring;
  case 0x193:
    sprintf(formatstring,"%s\"%s\"",s,SymTable[tokenval].lexptr);
    return formatstring;
  case 0x194:
    pcVar2 = "%sWITHIN";
    break;
  case 0x195:
    pcVar2 = "%s(end of pattern)";
    break;
  default:
    pcVar2 = "%s\'%c\'";
    uVar1 = lookahead;
LAB_001242f1:
    sprintf(formatstring,pcVar2,s,(ulong)uVar1);
    return formatstring;
  }
  sprintf(formatstring,pcVar2,s);
  return formatstring;
}

Assistant:

char* describeLookahead(char formatstring[], char *s) {

   if (lookahead == ID_TOK) {
     sprintf(formatstring,"%s\"%s\"", s, lexString(tokenval));
   }
   else if (lookahead == NUM_TOK) {
     sprintf(formatstring,"%s%d", s, tokenval);
   }
   else if (lookahead == REALNUM_TOK) {
     sprintf(formatstring,"%s%g", s, realtokval);
   }
   else if (lookahead == NOT_TOK) {
     sprintf(formatstring,"%sNOT", s);
   }
   else if (lookahead == WITHIN_TOK) {
     sprintf(formatstring,"%sWITHIN", s);
   }
   else if (lookahead == DONE_TOK) {
     sprintf(formatstring,"%s(end of pattern)", s);
   }
   else {
     sprintf(formatstring,"%s\'%c\'", s, lookahead);
   }
   return formatstring;
}